

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_fixed<double>(basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,double value)

{
  assert_error *paVar1;
  double local_18;
  double value_local;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18 = value;
  value_local = (double)this;
  if (this->m_pos != 0) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar1,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (this->m_data == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar1,"m_data");
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::append((string *)this->m_data,(char *)&local_18,8);
  return;
}

Assistant:

void add_fixed(T value) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
#if PROTOZERO_BYTE_ORDER != PROTOZERO_LITTLE_ENDIAN
        byteswap_inplace(&value);
#endif
        buffer_customization<TBuffer>::append(m_data, reinterpret_cast<const char*>(&value), sizeof(T));
    }